

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pushdown_inner_join.cpp
# Opt level: O0

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::FilterPushdown::PushdownInnerJoin
          (FilterPushdown *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *op,unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              *left_bindings,
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          *right_bindings)

{
  bool bVar1;
  FilterResult FVar2;
  pointer pLVar3;
  LogicalOperator *this_00;
  __uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> in_RDI;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
  *in_stack_00000050;
  FilterPushdown *in_stack_00000058;
  templated_unique_single_t cross_product;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> condition;
  JoinCondition *i;
  iterator __end2;
  iterator __begin2;
  vector<duckdb::JoinCondition,_true> *__range2;
  LogicalComparisonJoin *comp_join;
  LogicalAnyJoin *any_join;
  LogicalJoin *join;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
  *in_stack_00000430;
  FilterPushdown *in_stack_00000438;
  JoinCondition *in_stack_fffffffffffffeb8;
  pointer in_stack_fffffffffffffec0;
  JoinCondition *in_stack_fffffffffffffec8;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
  *in_stack_fffffffffffffef8;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *args;
  undefined4 in_stack_ffffffffffffff00;
  FilterResult in_stack_ffffffffffffff04;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
  *in_stack_ffffffffffffff08;
  unique_ptr<duckdb::LogicalCrossProduct,_std::default_delete<duckdb::LogicalCrossProduct>_>
  local_d0 [2];
  undefined4 in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff44;
  FilterPushdown *in_stack_ffffffffffffff48;
  __normal_iterator<duckdb::JoinCondition_*,_std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>_>
  local_78;
  vector<duckdb::JoinCondition,_true> *local_70;
  LogicalComparisonJoin *local_68;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> local_58;
  LogicalAnyJoin *local_50;
  LogicalJoin *local_30;
  
  pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                       *)in_stack_fffffffffffffec0);
  local_30 = LogicalOperator::Cast<duckdb::LogicalJoin>(pLVar3);
  pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                       *)in_stack_fffffffffffffec0);
  if (pLVar3->type == LOGICAL_DELIM_JOIN) {
    unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
    unique_ptr((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)in_stack_fffffffffffffec0,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)in_stack_fffffffffffffeb8);
    FinishPushdown(in_stack_00000058,in_stack_00000050);
    unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
    ~unique_ptr((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                 *)0x19bed15);
  }
  else {
    pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)in_stack_fffffffffffffec0);
    if (pLVar3->type == LOGICAL_ANY_JOIN) {
      local_50 = LogicalOperator::Cast<duckdb::LogicalAnyJoin>
                           ((LogicalOperator *)
                            CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
      args = &local_58;
      unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::unique_ptr
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 in_stack_fffffffffffffec0,&in_stack_fffffffffffffeb8->left);
      in_stack_ffffffffffffff04 =
           AddFilter(in_stack_ffffffffffffff48,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 0x19bedac);
      if (in_stack_ffffffffffffff04 == UNSATISFIABLE) {
        make_uniq<duckdb::LogicalEmptyResult,duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                  (args);
        unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>::
        unique_ptr<duckdb::LogicalEmptyResult,std::default_delete<std::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>>>,void>
                  ((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)in_stack_fffffffffffffec0,
                   (unique_ptr<duckdb::LogicalEmptyResult,_std::default_delete<duckdb::LogicalEmptyResult>_>
                    *)in_stack_fffffffffffffeb8);
        unique_ptr<duckdb::LogicalEmptyResult,_std::default_delete<duckdb::LogicalEmptyResult>,_true>
        ::~unique_ptr((unique_ptr<duckdb::LogicalEmptyResult,_std::default_delete<duckdb::LogicalEmptyResult>,_true>
                       *)0x19bede6);
        return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
               (_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                )in_RDI._M_t.
                 super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                 .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      }
    }
    else {
      local_68 = LogicalOperator::Cast<duckdb::LogicalComparisonJoin>
                           (&local_30->super_LogicalOperator);
      local_70 = &local_68->conditions;
      local_78._M_current =
           (JoinCondition *)
           ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::begin
                     (in_stack_fffffffffffffeb8);
      ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::end
                ((vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_> *)
                 in_stack_fffffffffffffeb8);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<duckdb::JoinCondition_*,_std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>_>
                                 *)in_stack_fffffffffffffec0,
                                (__normal_iterator<duckdb::JoinCondition_*,_std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>_>
                                 *)in_stack_fffffffffffffeb8), bVar1) {
        __gnu_cxx::
        __normal_iterator<duckdb::JoinCondition_*,_std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>_>
        ::operator*(&local_78);
        JoinCondition::JoinCondition
                  ((JoinCondition *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        JoinCondition::CreateExpression(in_stack_fffffffffffffec8);
        JoinCondition::~JoinCondition((JoinCondition *)in_stack_fffffffffffffec0);
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::unique_ptr
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffffec0,&in_stack_fffffffffffffeb8->left);
        FVar2 = AddFilter(in_stack_ffffffffffffff48,
                          (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   0x19bef15);
        if (FVar2 == UNSATISFIABLE) {
          make_uniq<duckdb::LogicalEmptyResult,duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                    (in_stack_fffffffffffffef8);
          unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>::
          unique_ptr<duckdb::LogicalEmptyResult,std::default_delete<std::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>>>,void>
                    ((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                      *)in_stack_fffffffffffffec0,
                     (unique_ptr<duckdb::LogicalEmptyResult,_std::default_delete<duckdb::LogicalEmptyResult>_>
                      *)in_stack_fffffffffffffeb8);
          unique_ptr<duckdb::LogicalEmptyResult,_std::default_delete<duckdb::LogicalEmptyResult>,_true>
          ::~unique_ptr((unique_ptr<duckdb::LogicalEmptyResult,_std::default_delete<duckdb::LogicalEmptyResult>,_true>
                         *)0x19bef55);
        }
        in_stack_ffffffffffffff44 = (uint)(FVar2 == UNSATISFIABLE);
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   0x19befd9);
        if (in_stack_ffffffffffffff44 != 0) {
          return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 )(_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                   )in_RDI._M_t.
                    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
        }
        __gnu_cxx::
        __normal_iterator<duckdb::JoinCondition_*,_std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>_>
        ::operator++(&local_78);
      }
    }
    GenerateFilters((FilterPushdown *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00))
    ;
    unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
    operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)in_stack_fffffffffffffec0);
    vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                  *)in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8);
    unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
    operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)in_stack_fffffffffffffec0);
    vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                  *)in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8);
    make_uniq<duckdb::LogicalCrossProduct,duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
              (in_stack_ffffffffffffff08,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)in_stack_fffffffffffffec0);
    if ((pLVar3->has_estimated_cardinality & 1U) != 0) {
      this_00 = (LogicalOperator *)
                unique_ptr<duckdb::LogicalCrossProduct,_std::default_delete<duckdb::LogicalCrossProduct>,_true>
                ::operator->((unique_ptr<duckdb::LogicalCrossProduct,_std::default_delete<duckdb::LogicalCrossProduct>,_true>
                              *)in_stack_fffffffffffffec0);
      in_stack_fffffffffffffec0 =
           unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                       *)in_stack_fffffffffffffec0);
      LogicalOperator::SetEstimatedCardinality
                (this_00,in_stack_fffffffffffffec0->estimated_cardinality);
    }
    unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>::
    unique_ptr<duckdb::LogicalCrossProduct,std::default_delete<std::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>>>,void>
              ((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)in_stack_fffffffffffffec0,local_d0);
    PushdownCrossProduct(in_stack_00000438,in_stack_00000430);
    unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
    ~unique_ptr((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                 *)0x19bf10f);
    unique_ptr<duckdb::LogicalCrossProduct,_std::default_delete<duckdb::LogicalCrossProduct>,_true>
    ::~unique_ptr((unique_ptr<duckdb::LogicalCrossProduct,_std::default_delete<duckdb::LogicalCrossProduct>,_true>
                   *)0x19bf127);
  }
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         )in_RDI._M_t.
          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<LogicalOperator> FilterPushdown::PushdownInnerJoin(unique_ptr<LogicalOperator> op,
                                                              unordered_set<idx_t> &left_bindings,
                                                              unordered_set<idx_t> &right_bindings) {
	auto &join = op->Cast<LogicalJoin>();
	D_ASSERT(join.join_type == JoinType::INNER);
	if (op->type == LogicalOperatorType::LOGICAL_DELIM_JOIN) {
		return FinishPushdown(std::move(op));
	}
	// inner join: gather all the conditions of the inner join and add to the filter list
	if (op->type == LogicalOperatorType::LOGICAL_ANY_JOIN) {
		auto &any_join = join.Cast<LogicalAnyJoin>();
		// any join: only one filter to add
		if (AddFilter(std::move(any_join.condition)) == FilterResult::UNSATISFIABLE) {
			// filter statically evaluates to false, strip tree
			return make_uniq<LogicalEmptyResult>(std::move(op));
		}
	} else {
		// comparison join
		D_ASSERT(op->type == LogicalOperatorType::LOGICAL_COMPARISON_JOIN);
		auto &comp_join = join.Cast<LogicalComparisonJoin>();
		// turn the conditions into filters
		for (auto &i : comp_join.conditions) {
			auto condition = JoinCondition::CreateExpression(std::move(i));
			if (AddFilter(std::move(condition)) == FilterResult::UNSATISFIABLE) {
				// filter statically evaluates to false, strip tree
				return make_uniq<LogicalEmptyResult>(std::move(op));
			}
		}
	}
	GenerateFilters();

	// turn the inner join into a cross product
	auto cross_product = make_uniq<LogicalCrossProduct>(std::move(op->children[0]), std::move(op->children[1]));

	// preserve the estimated cardinality of the operator
	if (op->has_estimated_cardinality) {
		cross_product->SetEstimatedCardinality(op->estimated_cardinality);
	}

	// then push down cross product
	return PushdownCrossProduct(std::move(cross_product));
}